

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.cpp
# Opt level: O2

void __thiscall
piksel::BaseApp::updateFramebufferSize(BaseApp *this,int framebufferWidth,int framebufferHeight)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float right;
  float bottom;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  this->framebufferWidth = framebufferWidth;
  this->framebufferHeight = framebufferHeight;
  (*glad_glViewport)(0,0,framebufferWidth,framebufferHeight);
  uVar1 = this->width;
  uVar2 = this->height;
  right = (float)(int)uVar1;
  bottom = (float)(int)uVar2;
  auVar4._8_4_ = right;
  auVar4._4_4_ = right;
  auVar4._12_4_ = right;
  auVar4._0_4_ = (float)framebufferWidth;
  auVar5._4_4_ = bottom;
  auVar5._0_4_ = (float)framebufferHeight;
  auVar5._8_8_ = 0;
  auVar5 = divps(auVar4,auVar5);
  fVar3 = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  if (fVar6 <= fVar3) {
    right = (fVar3 / fVar6) * right;
  }
  else {
    bottom = bottom * (fVar6 / fVar3);
  }
  glm::ortho<float>((mat<4,_4,_float,_(glm::qualifier)0> *)&local_58.field_0,0.0,right,bottom,0.0);
  *(undefined8 *)&(this->projectionMatrix).value[3].field_0 = local_28;
  *(undefined8 *)((long)&(this->projectionMatrix).value[3].field_0 + 8) = uStack_20;
  *(undefined8 *)&(this->projectionMatrix).value[2].field_0 = local_38;
  *(undefined8 *)((long)&(this->projectionMatrix).value[2].field_0 + 8) = uStack_30;
  *(undefined8 *)&(this->projectionMatrix).value[1].field_0 = local_48;
  *(undefined8 *)((long)&(this->projectionMatrix).value[1].field_0 + 8) = uStack_40;
  *(undefined8 *)&(this->projectionMatrix).value[0].field_0 = local_58._0_8_;
  *(undefined8 *)((long)&(this->projectionMatrix).value[0].field_0 + 8) = local_58._8_8_;
  return;
}

Assistant:

void BaseApp::updateFramebufferSize(int framebufferWidth, int framebufferHeight) {
    this->framebufferWidth = framebufferWidth;
    this->framebufferHeight = framebufferHeight;
    glViewport(0, 0, framebufferWidth, framebufferHeight);
    float framebufferRatio = framebufferWidth / (float) framebufferHeight;
    float ratio = width / (float) height;
    if (framebufferRatio >= ratio) {
        projectionMatrix = glm::ortho(0.0f, (framebufferRatio / ratio) * width, (float) height, 0.0f);
    } else {
        projectionMatrix = glm::ortho(0.0f, (float) width, (ratio / framebufferRatio) * height, 0.0f);
    }
#if FXAA
    if (postfx_texture) {
        glBindTexture(GL_TEXTURE_2D, postfx_texture);
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, framebufferWidth, framebufferHeight, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
    }
#endif
}